

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b_tree_node.cpp
# Opt level: O0

void __thiscall b_tree_node::_split_child(b_tree_node *this,int i,int64_t ofs)

{
  pager *p;
  uint uVar1;
  bool bVar2;
  uint16_t uVar3;
  int64_t iVar4;
  uint local_10c;
  uint local_108;
  int j_3;
  int j_2;
  int j_1;
  int j;
  undefined1 local_f0 [8];
  b_tree_node new_node;
  b_tree_node original_node;
  int64_t ofs_local;
  int i_local;
  b_tree_node *this_local;
  
  b_tree_node((b_tree_node *)&new_node._child_ofs_field,this->_p,ofs);
  p = this->_p;
  uVar3 = _min_degree((b_tree_node *)&new_node._child_ofs_field);
  bVar2 = _leaf((b_tree_node *)&new_node._child_ofs_field);
  b_tree_node((b_tree_node *)local_f0,p,uVar3,bVar2);
  uVar3 = _min_degree(this);
  _set_num_keys((b_tree_node *)local_f0,uVar3 - 1);
  for (j_2 = 0; uVar3 = _min_degree(this), j_2 < (int)(uVar3 - 1); j_2 = j_2 + 1) {
    uVar3 = _min_degree(this);
    *(undefined8 *)(new_node._num_keys_field + (long)j_2 * 4) =
         *(undefined8 *)(original_node._num_keys_field + (long)(int)(j_2 + (uint)uVar3) * 4);
    uVar3 = _min_degree(this);
    *(undefined1 *)((long)new_node._keys_field + (long)j_2) =
         *(undefined1 *)((long)original_node._keys_field + (long)(int)(j_2 + (uint)uVar3));
    uVar3 = _min_degree(this);
    *(undefined8 *)(new_node._valid_keys_field + (long)j_2 * 8) =
         *(undefined8 *)(original_node._valid_keys_field + (long)(int)(j_2 + (uint)uVar3) * 8);
  }
  bVar2 = _leaf((b_tree_node *)&new_node._child_ofs_field);
  if (!bVar2) {
    for (j_3 = 0; uVar3 = _min_degree(this), j_3 < (int)(uint)uVar3; j_3 = j_3 + 1) {
      uVar3 = _min_degree(this);
      new_node._vals_field[j_3] = original_node._vals_field[(int)(j_3 + (uint)uVar3)];
    }
  }
  uVar3 = _min_degree(this);
  _set_num_keys((b_tree_node *)&new_node._child_ofs_field,uVar3 - 1);
  uVar3 = _num_keys(this);
  for (local_108 = (uint)uVar3; i + 1 <= (int)local_108; local_108 = local_108 - 1) {
    this->_child_ofs_field[(int)(local_108 + 1)] = this->_child_ofs_field[(int)local_108];
  }
  iVar4 = _ofs((b_tree_node *)local_f0);
  this->_child_ofs_field[(long)i + 1] = iVar4;
  uVar3 = _num_keys(this);
  uVar1 = (uint)uVar3;
  while (local_10c = uVar1 - 1, i <= (int)local_10c) {
    this->_keys_field[(int)uVar1] = this->_keys_field[(int)local_10c];
    this->_valid_keys_field[(int)uVar1] = this->_valid_keys_field[(int)local_10c];
    this->_vals_field[(int)uVar1] = this->_vals_field[(int)local_10c];
    uVar1 = local_10c;
  }
  uVar3 = _min_degree(this);
  this->_keys_field[i] = *(int64_t *)(original_node._num_keys_field + (ulong)uVar3 * 4 + -4);
  uVar3 = _min_degree(this);
  this->_valid_keys_field[i] = *(uint8_t *)(((ulong)uVar3 - 1) + (long)original_node._keys_field);
  uVar3 = _min_degree(this);
  this->_vals_field[i] = *(int64_t *)(original_node._valid_keys_field + (ulong)uVar3 * 8 + -8);
  uVar3 = _num_keys(this);
  _set_num_keys(this,uVar3 + 1);
  ~b_tree_node((b_tree_node *)local_f0);
  ~b_tree_node((b_tree_node *)&new_node._child_ofs_field);
  return;
}

Assistant:

void b_tree_node::_split_child(int i, int64_t ofs)
{
    b_tree_node original_node(_p, ofs);

    // Create a new node which is going to store (t-1) keys
    // of original_node
    b_tree_node new_node(_p, original_node._min_degree(), original_node._leaf());
    new_node._set_num_keys(_min_degree() - 1);
 
    // Copy the last (min_degree-1) keys of original_node to new_node
    for (int j = 0; j < _min_degree()-1; j++)
    {
        new_node._keys_field[j] = original_node._keys_field[j+_min_degree()];
        new_node._valid_keys_field[j] = original_node._valid_keys_field[j+_min_degree()];
        new_node._vals_field[j] = original_node._vals_field[j+_min_degree()];
    }
 
    // Copy the last min_degree children of original_node to new_node
    if (original_node._leaf() == false)
    {
        for (int j = 0; j < _min_degree(); j++)
            new_node._child_ofs_field[j] = original_node._child_ofs_field[j+_min_degree()];
    }
 
    // Reduce the number of keys in original_node
    original_node._set_num_keys(_min_degree() - 1);
 
    // Since this node is going to have a new child,
    // create space of new child
    for (int j = _num_keys(); j >= i+1; j--)
        _child_ofs_field[j+1] = _child_ofs_field[j];
 
    // Link the new child to this node
    _child_ofs_field[i+1] = new_node._ofs();
 
    // A key of original_node will move to this node. Find the location of
    // new key and move all greater keys one space ahead
    for (int j = _num_keys()-1; j >= i; j--)
    {
        _keys_field[j+1] = _keys_field[j];
        _valid_keys_field[j+1] = _valid_keys_field[j];
        _vals_field[j+1] = _vals_field[j];
    }
 
    // Copy the middle key of original_node to this node
    _keys_field[i] = original_node._keys_field[_min_degree()-1];
    _valid_keys_field[i] = original_node._valid_keys_field[_min_degree()-1];
    _vals_field[i] = original_node._vals_field[_min_degree()-1];
 
    // Increment count of keys in this node
    _set_num_keys(_num_keys() + 1);
}